

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void lowbd_inv_txfm2d_add_no_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  int out_size;
  int iVar1;
  int iVar2;
  uint col;
  uint row;
  char *pcVar3;
  code *pcVar4;
  code *pcVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  int iVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint stride_00;
  uint uVar36;
  __m128i *out;
  __m128i *out_00;
  ulong uVar37;
  __m128i *palVar38;
  ulong uVar39;
  undefined7 in_register_00000081;
  ulong uVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  uint uVar43;
  long lVar44;
  int iVar45;
  __m128i *palVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  byte local_2550;
  int local_254c;
  __m128i *local_2510;
  __m128i temp [8];
  __m128i buf0 [64];
  __m128i buf1 [512];
  
  uVar34 = (uint)tx_type;
  local_254c = 0;
  uVar37 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  uVar43 = 0;
  iVar45 = 0;
  if (eob != 1) {
    uVar43 = (int)av1_eob_to_eobxy_default[uVar37]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + uVar37) & 0x1f)] & 0xff;
    iVar45 = (int)av1_eob_to_eobxy_default[uVar37]
                  [eob + -1 >> (*(byte *)(tx_size_wide_log2_eob + uVar37) & 0x1f)] >> 8;
  }
  pcVar3 = av1_inv_txfm_shift_ls[uVar37];
  uVar37 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) * 4);
  iVar1 = *(int *)((long)tx_size_wide_log2 + uVar37);
  iVar2 = *(int *)((long)tx_size_high_log2 + uVar37);
  col = *(uint *)((long)tx_size_wide + uVar37);
  row = *(uint *)((long)tx_size_high + uVar37);
  lVar44 = (long)(int)row;
  uVar36 = (int)col >> 3;
  uVar35 = iVar45 + 8 >> 3;
  stride_00 = 0x20;
  if ((int)row < 0x20) {
    stride_00 = row;
  }
  iVar32 = get_rect_tx_log_ratio(col,row);
  bVar47 = true;
  if (tx_type < 0x10) {
    if ((0x4110U >> (uVar34 & 0x1f) & 1) == 0) {
      if ((0x80a0U >> (uVar34 & 0x1f) & 1) == 0) {
        local_2550 = 1;
        if (uVar34 != 6) goto LAB_00374229;
        local_254c = 1;
        local_2550 = 0;
      }
      else {
        local_254c = 0;
        local_2550 = 1;
      }
      bVar47 = false;
    }
    else {
      local_254c = 1;
      local_2550 = 0;
    }
  }
  else {
    local_2550 = 1;
  }
LAB_00374229:
  out_size = (uVar43 & 0xfffffff8) + 8;
  pcVar4 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar1 * 0x60 + 0x55bf40 +
                     (long)lowbd_txfm_all_1d_zeros_idx[uVar43] * 8);
  uVar37 = 0;
  uVar39 = 0;
  if (0 < (int)uVar36) {
    uVar39 = (ulong)uVar36;
  }
  pcVar5 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar2 * 0x60 + 0x55bf40 +
                     (long)lowbd_txfm_all_1d_zeros_idx[iVar45] * 8);
  uVar33 = (ulong)uVar35;
  if ((int)uVar35 < 1) {
    uVar33 = uVar37;
  }
  palVar38 = buf1 + ((long)(int)uVar36 + -1) * lVar44;
  local_2510 = buf1;
  for (; uVar37 != uVar33; uVar37 = uVar37 + 1) {
    load_buffer_32bit_to_16bit(input + uVar37 * 8,stride_00,buf0,out_size);
    if ((iVar32 == 1) || (iVar32 == -1)) {
      round_shift_ssse3(buf0,buf0,out_size);
    }
    (*pcVar4)(buf0,buf0);
    round_shift_16bit_ssse3(buf0,col,(int)*pcVar3);
    out_00 = palVar38;
    out = local_2510;
    uVar40 = uVar39;
    palVar46 = buf0;
    if (bVar47) {
      while (uVar40 != 0) {
        transpose_16bit_8x8(palVar46,out);
        out = out + lVar44;
        uVar40 = uVar40 - 1;
        palVar46 = palVar46 + 8;
      }
    }
    else {
      while (uVar40 != 0) {
        flip_buf_sse2(palVar46,temp,8);
        transpose_16bit_8x8(temp,out_00);
        out_00 = out_00 + -lVar44;
        uVar40 = uVar40 - 1;
        palVar46 = palVar46 + 8;
      }
    }
    palVar38 = palVar38 + 8;
    local_2510 = local_2510 + 8;
  }
  palVar38 = buf1;
  while (bVar47 = uVar39 != 0, uVar39 = uVar39 - 1, bVar47) {
    (*pcVar5)(palVar38,palVar38);
    round_shift_16bit_ssse3(palVar38,row,(int)pcVar3[1]);
    palVar38 = palVar38 + lVar44;
  }
  if ((0x75f1cUL >> ((ulong)tx_size & 0x3f) & 1) == 0) {
    if ((0x80c2UL >> ((ulong)tx_size & 0x3f) & 1) != 0) {
      lowbd_write_buffer_8xn_sse2(buf1,output,stride,local_254c,row);
    }
  }
  else {
    uVar39 = 0;
    uVar37 = (long)(int)(row - 1);
    if (local_2550 != 0) {
      uVar37 = uVar39;
    }
    uVar33 = (ulong)row;
    if ((int)row < 1) {
      uVar33 = uVar39;
    }
    for (uVar40 = 0; uVar40 != col >> 4; uVar40 = uVar40 + 1) {
      palVar38 = buf1 + uVar37 + (long)(int)uVar39;
      uVar41 = uVar33;
      pauVar42 = (undefined1 (*) [16])output;
      while (bVar47 = uVar41 != 0, uVar41 = uVar41 - 1, bVar47) {
        auVar49 = *pauVar42;
        auVar22[0xd] = 0;
        auVar22._0_13_ = auVar49._0_13_;
        auVar22[0xe] = auVar49[7];
        auVar23[0xc] = auVar49[6];
        auVar23._0_12_ = auVar49._0_12_;
        auVar23._13_2_ = auVar22._13_2_;
        auVar24[0xb] = 0;
        auVar24._0_11_ = auVar49._0_11_;
        auVar24._12_3_ = auVar23._12_3_;
        auVar25[10] = auVar49[5];
        auVar25._0_10_ = auVar49._0_10_;
        auVar25._11_4_ = auVar24._11_4_;
        auVar26[9] = 0;
        auVar26._0_9_ = auVar49._0_9_;
        auVar26._10_5_ = auVar25._10_5_;
        auVar27[8] = auVar49[4];
        auVar27._0_8_ = auVar49._0_8_;
        auVar27._9_6_ = auVar26._9_6_;
        auVar29._7_8_ = 0;
        auVar29._0_7_ = auVar27._8_7_;
        auVar30._1_8_ = SUB158(auVar29 << 0x40,7);
        auVar30[0] = auVar49[3];
        auVar30._9_6_ = 0;
        auVar31._1_10_ = SUB1510(auVar30 << 0x30,5);
        auVar31[0] = auVar49[2];
        auVar31._11_4_ = 0;
        auVar28[2] = auVar49[1];
        auVar28._0_2_ = auVar49._0_2_;
        auVar28._3_12_ = SUB1512(auVar31 << 0x20,3);
        auVar50._0_2_ = auVar49._0_2_ & 0xff;
        auVar50._2_13_ = auVar28._2_13_;
        auVar50[0xf] = 0;
        auVar48[1] = 0;
        auVar48[0] = auVar49[8];
        auVar48[2] = auVar49[9];
        auVar48[3] = 0;
        auVar48[4] = auVar49[10];
        auVar48[5] = 0;
        auVar48[6] = auVar49[0xb];
        auVar48[7] = 0;
        auVar48[8] = auVar49[0xc];
        auVar48[9] = 0;
        auVar48[10] = auVar49[0xd];
        auVar48[0xb] = 0;
        auVar48[0xc] = auVar49[0xe];
        auVar48[0xd] = 0;
        auVar48[0xe] = auVar49[0xf];
        auVar48[0xf] = 0;
        auVar50 = paddsw(auVar50,(undefined1  [16])*palVar38);
        auVar49 = paddsw(auVar48,(undefined1  [16])palVar38[lVar44]);
        sVar6 = auVar50._0_2_;
        sVar7 = auVar50._2_2_;
        sVar8 = auVar50._4_2_;
        sVar9 = auVar50._6_2_;
        sVar10 = auVar50._8_2_;
        sVar11 = auVar50._10_2_;
        sVar12 = auVar50._12_2_;
        sVar13 = auVar50._14_2_;
        sVar14 = auVar49._0_2_;
        sVar15 = auVar49._2_2_;
        sVar16 = auVar49._4_2_;
        sVar17 = auVar49._6_2_;
        sVar18 = auVar49._8_2_;
        sVar19 = auVar49._10_2_;
        sVar20 = auVar49._12_2_;
        sVar21 = auVar49._14_2_;
        (*pauVar42)[0] = (0 < sVar6) * (sVar6 < 0x100) * auVar50[0] - (0xff < sVar6);
        (*pauVar42)[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar50[2] - (0xff < sVar7);
        (*pauVar42)[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar50[4] - (0xff < sVar8);
        (*pauVar42)[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar50[6] - (0xff < sVar9);
        (*pauVar42)[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar50[8] - (0xff < sVar10);
        (*pauVar42)[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar50[10] - (0xff < sVar11);
        (*pauVar42)[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar50[0xc] - (0xff < sVar12);
        (*pauVar42)[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar50[0xe] - (0xff < sVar13);
        (*pauVar42)[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar49[0] - (0xff < sVar14);
        (*pauVar42)[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar49[2] - (0xff < sVar15);
        (*pauVar42)[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar49[4] - (0xff < sVar16);
        (*pauVar42)[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar49[6] - (0xff < sVar17);
        (*pauVar42)[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar49[8] - (0xff < sVar18);
        (*pauVar42)[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar49[10] - (0xff < sVar19);
        (*pauVar42)[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar49[0xc] - (0xff < sVar20);
        (*pauVar42)[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar49[0xe] - (0xff < sVar21);
        palVar38 = palVar38 + (ulong)local_2550 * 2 + -1;
        pauVar42 = (undefined1 (*) [16])(*pauVar42 + stride);
      }
      uVar39 = (ulong)((int)uVar39 + row * 2);
      output = (uint8_t *)((long)output + 0x10);
    }
  }
  return;
}

Assistant:

static inline void lowbd_inv_txfm2d_add_no_identity_ssse3(
    const int32_t *input, uint8_t *output, int stride, TX_TYPE tx_type,
    TX_SIZE tx_size, int eob) {
  __m128i buf1[64 * 8];
  int eobx, eoby;
  get_eobx_eoby_scan_default(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int buf_size_nonzero_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx_x = lowbd_txfm_all_1d_zeros_idx[eobx];
  const int fun_idx_y = lowbd_txfm_all_1d_zeros_idx[eoby];
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx_x];
  const transform_1d_ssse3 col_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txh_idx][vitx_1d_tab[tx_type]][fun_idx_y];

  assert(col_txfm != NULL);
  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_nonzero_h_div8; i++) {
    __m128i buf0[64];
    load_buffer_32bit_to_16bit(input + 8 * i, input_stride, buf0,
                               buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_ssse3(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_ssse3(buf0, txfm_size_col, shift[0]);
    __m128i *_buf1 = buf1 + i * 8;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        __m128i temp[8];
        flip_buf_sse2(buf0 + 8 * j, temp, 8);
        transpose_16bit_8x8(temp,
                            _buf1 + txfm_size_row * (buf_size_w_div8 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_16bit_8x8(buf0 + 8 * j, _buf1 + txfm_size_row * j);
      }
    }
  }
  for (int i = 0; i < buf_size_w_div8; i++) {
    col_txfm(buf1 + i * txfm_size_row, buf1 + i * txfm_size_row);
    round_shift_16bit_ssse3(buf1 + i * txfm_size_row, txfm_size_row, shift[1]);
  }

  if (txfm_size_col >= 16) {
    for (int i = 0; i < (txfm_size_col >> 4); i++) {
      lowbd_write_buffer_16xn_sse2(buf1 + i * txfm_size_row * 2,
                                   output + 16 * i, stride, ud_flip,
                                   txfm_size_row);
    }
  } else if (txfm_size_col == 8) {
    lowbd_write_buffer_8xn_sse2(buf1, output, stride, ud_flip, txfm_size_row);
  }
}